

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O1

void __thiscall
Importer_accessImportedModelLibrary_Test::~Importer_accessImportedModelLibrary_Test
          (Importer_accessImportedModelLibrary_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Importer, accessImportedModelLibrary)
{
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(fileContents("importer/diamond.cellml"));
    auto importer = libcellml::Importer::create();
    auto printer = libcellml::Printer::create();

    importer->resolveImports(model, resourcePath("importer/"));
    EXPECT_FALSE(model->hasUnresolvedImports());

    // Library should contain left, right, and one instance (not two) of the point.
    EXPECT_EQ(size_t(3), importer->libraryCount());

    // Test that the library items have the expected keys.
    EXPECT_EQ(resourcePath("importer/diamond_left.cellml"), importer->key(0));
    EXPECT_EQ(resourcePath("importer/diamond_point.cellml"), importer->key(1));
    EXPECT_EQ(resourcePath("importer/diamond_right.cellml"), importer->key(2));
    EXPECT_EQ("", importer->key(999));

    // Access library items by their URL.
    auto left = importer->library(resourcePath("importer/diamond_left.cellml"));
    auto right = importer->library(resourcePath("importer/diamond_right.cellml"));
    auto point = importer->library(resourcePath("importer/diamond_point.cellml"));

    // Test that the library items are the same as those in the files.
    EXPECT_EQ(fileContents("importer/diamond_left.cellml"), printer->printModel(left));
    EXPECT_EQ(fileContents("importer/diamond_right.cellml"), printer->printModel(right));
    EXPECT_EQ(fileContents("importer/diamond_point.cellml"), printer->printModel(point));
}